

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

int Ver_ParseFormalNetsAreDriven(Abc_Ntk_t *pNtk,char *pNameFormal)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  ulong uVar11;
  
  lVar7 = (long)*(int *)((long)pNtk->pData + 4);
  if (0 < lVar7) {
    lVar2 = *(long *)((long)pNtk->pData + 8);
    lVar9 = 0;
    puVar10 = (undefined8 *)0x0;
    do {
      lVar5 = *(long *)(*(long *)(lVar2 + lVar9 * 8) + 0x40);
      iVar1 = *(int *)(lVar5 + 4);
      if (iVar1 < 1) {
LAB_00353219:
        if (puVar10 == (undefined8 *)0x0) {
          __assert_fail("pBundle",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verCore.c"
                        ,0x9bc,"int Ver_ParseFormalNetsAreDriven(Abc_Ntk_t *, char *)");
        }
        lVar5 = (long)*(int *)(puVar10[1] + 4);
        if (0 < lVar5) {
          lVar8 = 0;
          do {
            if (0 < *(int *)(*(long *)(*(long *)(puVar10[1] + 8) + lVar8 * 8) + 0x1c)) {
              return 1;
            }
            lVar8 = lVar8 + 1;
          } while (lVar5 != lVar8);
        }
      }
      else {
        uVar11 = (ulong)(iVar1 - 1);
        iVar6 = iVar1;
        do {
          if (iVar1 < iVar6) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          puVar10 = *(undefined8 **)(*(long *)(lVar5 + 8) + uVar11 * 8);
          iVar6 = (int)uVar11;
          if ((puVar10 != (undefined8 *)0x0) &&
             (iVar4 = strcmp((char *)*puVar10,pNameFormal), iVar4 == 0)) goto LAB_00353214;
          bVar3 = 0 < (long)uVar11;
          uVar11 = uVar11 - 1;
        } while (bVar3);
        uVar11 = 0xffffffff;
LAB_00353214:
        if ((int)uVar11 != iVar1) goto LAB_00353219;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar7);
  }
  return 0;
}

Assistant:

int Ver_ParseFormalNetsAreDriven( Abc_Ntk_t * pNtk, char * pNameFormal )
{
    Ver_Bundle_t * pBundle = NULL;
    Abc_Obj_t * pBox, * pNet;
    int k, j, m;
    // go through instances of this type
    Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
    {
        // find a bundle with the given name in this instance
        Vec_PtrForEachEntryReverse( Ver_Bundle_t *, (Vec_Ptr_t *)pBox->pCopy, pBundle, j )
            if ( pBundle && !strcmp( pBundle->pNameFormal, pNameFormal ) )
                break;
        // skip non-driven bundles
        if ( j == Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) )
            continue;
        // check if all nets are driven in this bundle
        assert(pBundle); // Verify that pBundle was assigned to.
        Vec_PtrForEachEntry( Abc_Obj_t *, pBundle->vNetsActual, pNet, m )
            if ( Abc_ObjFaninNum(pNet) > 0 )
                return 1;
    }
    return 0;
}